

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void assert_watch_file_current_dir(uv_loop_t *loop,int file_or_dir)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *path;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  
  path = "watch_file";
  pcVar3 = "watch_file";
  remove("watch_file");
  create_file(pcVar3);
  iVar1 = uv_fs_event_init(loop,&fs_event);
  if (iVar1 == 0) {
    if (file_or_dir == 1) {
      path = ".";
    }
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,path,0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(loop,&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb_touch,100,0);
        if (iVar1 == 0) {
          if (timer_cb_touch_called == 0) {
            if (fs_event_cb_called == '\x01') {
              pcVar3 = "fs_event_cb_called == 0";
              uVar2 = 0x1b8;
            }
            else {
              uv_run(loop,UV_RUN_DEFAULT);
              if (timer_cb_touch_called == 1) {
                if (fs_event_cb_called != '\0') {
                  remove("watch_file");
                  fs_event_cb_called = 0;
                  timer_cb_touch_called = 0;
                  uv_run(loop,UV_RUN_DEFAULT);
                  return;
                }
                pcVar3 = "fs_event_cb_called == 1";
                uVar2 = 0x1bd;
              }
              else {
                pcVar3 = "timer_cb_touch_called == 1";
                uVar2 = 0x1bc;
              }
            }
          }
          else {
            pcVar3 = "timer_cb_touch_called == 0";
            uVar2 = 0x1b7;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x1b5;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x1b2;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x1af;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x1a8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void assert_watch_file_current_dir(uv_loop_t* const loop, int file_or_dir) {
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  /* watching a dir is the only way to get fsevents involved on apple
     platforms */
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        file_or_dir == 1 ? "." : "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
  ASSERT(r == 0);

  ASSERT(timer_cb_touch_called == 0);
  ASSERT(fs_event_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(timer_cb_touch_called == 1);
  ASSERT(fs_event_cb_called == 1);

  /* Cleanup */
  remove("watch_file");
  fs_event_cb_called = 0;
  timer_cb_touch_called = 0;
  uv_run(loop, UV_RUN_DEFAULT); /* flush pending closes */
}